

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_align.c
# Opt level: O3

int32 align_start_utt(char *uttid)

{
  snode_t *psVar1;
  snode_t **ppsVar2;
  long lVar3;
  slink_s *psVar4;
  long lVar5;
  
  ppsVar2 = cur_active;
  lVar3 = 0;
  curfrm = 0;
  shead.score = 0;
  shead.hist = (history_t *)0x0;
  hist_head = (history_t *)0x0;
  n_active = 0;
  if (shead.succlist != (slink_s *)0x0) {
    psVar4 = shead.succlist;
    lVar5 = 0;
    do {
      psVar1 = psVar4->node;
      if (-1 < psVar1->active_frm) {
        __assert_fail("l->node->active_frm < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/s3_align.c"
                      ,0x40d,"int32 align_start_utt(char *)");
      }
      psVar1->active_frm = 0;
      lVar3 = lVar5 + 1;
      n_active = (int32)lVar3;
      ppsVar2[lVar5] = psVar1;
      psVar4 = psVar4->next;
      lVar5 = lVar3;
    } while (psVar4 != (slink_s *)0x0);
  }
  n_active = (int)lVar3 + 1;
  ppsVar2[(int)lVar3] = (snode_t *)0x0;
  return 0;
}

Assistant:

int32
align_start_utt(char *uttid)
{
    slink_t *l;

    curfrm = 0;
    shead.score = 0;
    shead.hist = NULL;
    hist_head = NULL;

    n_active = 0;
    for (l = shead.succlist; l; l = l->next) {
        assert(l->node->active_frm < 0);
        l->node->active_frm = 0;
        cur_active[n_active++] = l->node;
    }
    cur_active[n_active++] = NULL;

    return 0;
}